

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

apprun_env_item_t * apprun_env_item_export(apprun_env_item_t *item)

{
  _Bool _Var1;
  apprun_env_item_t *paVar2;
  char *pcVar3;
  char *pcVar4;
  
  if ((item->original_value == (char *)0x0) && (item->startup_value == (char *)0x0)) {
    pcVar4 = item->current_value;
    if (pcVar4 == (char *)0x0) {
      paVar2 = (apprun_env_item_t *)0x0;
    }
    else {
      paVar2 = (apprun_env_item_t *)calloc(1,0x20);
      pcVar3 = strdup(item->name);
      paVar2->name = pcVar3;
      pcVar4 = strdup(pcVar4);
      paVar2->current_value = pcVar4;
    }
    return paVar2;
  }
  _Var1 = apprun_env_item_is_changed(item);
  if (_Var1) {
    paVar2 = apprun_env_item_changed_export(item);
    return paVar2;
  }
  paVar2 = apprun_env_item_unchanged_export(item);
  return paVar2;
}

Assistant:

apprun_env_item_t *apprun_env_item_export(apprun_env_item_t *item) {
    if (!apprun_env_item_is_tracked(item)) {
        if (item->current_value == NULL)
            return NULL;

        apprun_env_item_t *copy = calloc(1, sizeof(apprun_env_item_t));
        copy->name = strdup(item->name);
        copy->current_value = strdup(item->current_value);

        return copy;
    }

    if (apprun_env_item_is_changed(item))
        return apprun_env_item_changed_export(item);
    else
        return apprun_env_item_unchanged_export(item);
}